

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  FILE *__stream;
  int b;
  int g;
  int r;
  int black;
  gdImagePtr prev;
  gdImagePtr im;
  FILE *out;
  int i;
  
  _r = 0;
  lVar6 = gdImageCreate(100);
  if (lVar6 == 0) {
    fprintf(_stderr,"can\'t create image");
    out._4_4_ = 1;
  }
  else {
    __stream = fopen("anim.gif","wb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"can\'t create file %s","anim.gif");
      out._4_4_ = 1;
    }
    else {
      gdImageColorAllocate(lVar6,0xff,0xff);
      gdImageGifAnimBegin(lVar6,__stream,1,0xffffffff);
      for (out._0_4_ = 0; (int)out < 0x14; out._0_4_ = (int)out + 1) {
        lVar6 = gdImageCreate(100);
        iVar1 = rand();
        iVar2 = rand();
        iVar3 = rand();
        gdImageColorAllocate(lVar6,0xff,0xff);
        uVar4 = gdImageColorAllocate(lVar6,iVar1 % 0xff,iVar2 % 0xff,iVar3 % 0xff);
        printf("(%i, %i, %i)\n",(ulong)(uint)(iVar1 % 0xff),(ulong)(uint)(iVar2 % 0xff),
               (ulong)(uint)(iVar3 % 0xff));
        iVar1 = rand();
        iVar2 = rand();
        iVar3 = rand();
        iVar5 = rand();
        gdImageFilledRectangle
                  (lVar6,iVar1 % 100,iVar2 % 100,iVar3 % 100,(long)iVar5 % 100 & 0xffffffff,uVar4);
        gdImageGifAnimAdd(lVar6,__stream,1,0,0,10,1,_r);
        if (_r != 0) {
          gdImageDestroy(_r);
        }
        _r = lVar6;
      }
      gdImageGifAnimEnd(__stream);
      fclose(__stream);
      out._4_4_ = 0;
    }
  }
  return out._4_4_;
}

Assistant:

int main(void)
{
	int i;
	FILE * out;

	gdImagePtr im;
	gdImagePtr prev =NULL;
	int black;

	im = gdImageCreate(100, 100);
	if (!im) {
		fprintf(stderr, "can't create image");
		return 1;
	}

	out = fopen("anim.gif", "wb");
	if (!out) {
		fprintf(stderr, "can't create file %s", "anim.gif");
		return 1;
	}

	gdImageColorAllocate(im, 255, 255, 255); /* allocate white as side effect */
	gdImageGifAnimBegin(im, out, 1, -1);

	for(i = 0; i < 20; i++) {
		int r,g,b;
		im = gdImageCreate(100, 100);
		r = rand() % 255;
		g = rand() % 255;
		b = rand() % 255;

		gdImageColorAllocate(im, 255, 255, 255);  /* allocate white as side effect */
		black = gdImageColorAllocate(im,  r, g, b);
		printf("(%i, %i, %i)\n",r, g, b);
		gdImageFilledRectangle(im, rand() % 100, rand() % 100, rand() % 100, rand() % 100, black);
		gdImageGifAnimAdd(im, out, 1, 0, 0, 10, 1, prev);

		if(prev) {
			gdImageDestroy(prev);
		}
		prev = im;
	}

	gdImageGifAnimEnd(out);
	fclose(out);

	return 0;
}